

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

void __thiscall
VulkanHppGenerator::readVideoRequireCapabilities
          (VulkanHppGenerator *this,XMLElement *element,VideoCodec *videoCodec)

{
  _Rb_tree_node_base *this_00;
  pointer pVVar1;
  pointer pcVar2;
  _Base_ptr __n;
  pointer pcVar3;
  EnumValueData *pEVar4;
  VulkanHppGenerator *pVVar5;
  _Alloc_hider __s2;
  _Base_ptr p_Var6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  iterator iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr *this_01;
  long lVar18;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> childElements;
  VideoRequireCapabilities requireCapabilities;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attributes;
  undefined1 local_2c8 [8];
  pointer ppXStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  _Base_ptr local_2a8;
  size_t sStack_2a0;
  undefined1 local_298 [32];
  _Base_ptr local_278;
  size_t sStack_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  int local_23c;
  undefined1 local_238 [32];
  _Base_ptr local_218;
  size_t sStack_210;
  undefined1 local_208 [32];
  _Base_ptr local_1e8;
  size_t sStack_1e0;
  undefined1 local_1d8 [32];
  _Base_ptr local_1b8;
  size_t sStack_1b0;
  VideoCodec *local_1a8;
  VulkanHppGenerator *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  _Alloc_hider _Stack_130;
  _Base_ptr local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  undefined1 local_108 [80];
  undefined1 local_b8 [88];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  iVar7 = (element->super_XMLNode)._parseLineNum;
  local_1a8 = videoCodec;
  getAttributes_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60,element);
  local_2b8._8_8_ = &ppXStack_2c0;
  local_2b8._M_allocated_capacity = 0;
  local_2c8 = (undefined1  [8])0x0;
  ppXStack_2c0 = (pointer)0x0;
  sStack_2a0 = 0;
  local_2a8 = (_Base_ptr)local_2b8._8_8_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[7],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_158,(char (*) [7])0x246b59,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
  local_208._24_8_ = local_208 + 8;
  local_208._16_8_ = (_Base_ptr)0x0;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = 0;
  sStack_1e0 = 0;
  local_1e8 = (_Base_ptr)local_208._24_8_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[7],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_108,(char (*) [7])0x2265c9,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_208);
  local_238._24_8_ = local_238 + 8;
  local_238._16_8_ = (_Base_ptr)0x0;
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = 0;
  sStack_210 = 0;
  local_218 = (_Base_ptr)local_238._24_8_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pair<const_char_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_b8,(char (*) [6])0x233c00,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_238);
  __l._M_len = 3;
  __l._M_array = (iterator)local_158;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)local_298,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_260,(allocator_type *)&local_198);
  local_1d8._24_8_ = local_1d8 + 8;
  local_1d8._16_8_ = (_Base_ptr)0x0;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_8_ = 0;
  sStack_1b0 = 0;
  local_1b8 = (_Base_ptr)local_1d8._24_8_;
  local_1a0 = this;
  checkAttributes(iVar7,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_60,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_298,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_1d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_1d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)local_298);
  lVar18 = -0xf0;
  this_01 = (_Base_ptr *)(local_b8 + 0x20);
  do {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01);
    if ((_Base_ptr)(this_01 + -2) != this_01[-4]) {
      operator_delete(this_01[-4],*(long *)(this_01 + -2) + 1);
    }
    this_01 = this_01 + -10;
    lVar18 = lVar18 + 0x50;
  } while (lVar18 != 0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_238);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2c8);
  local_2c8 = (undefined1  [8])0x0;
  ppXStack_2c0 = (XMLElement **)0x0;
  local_2b8._M_allocated_capacity = 0;
  local_158._0_8_ = tinyxml2::XMLNode::FirstChildElement(&element->super_XMLNode,(char *)0x0);
  for (; (XMLElement *)local_158._0_8_ != (XMLElement *)0x0;
      local_158._0_8_ =
           tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_158._0_8_,(char *)0x0)) {
    if (ppXStack_2c0 == (pointer)local_2b8._M_allocated_capacity) {
      std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
      _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>> *)
                 local_2c8,(iterator)ppXStack_2c0,(XMLElement **)local_158);
    }
    else {
      *ppXStack_2c0 = (XMLElement *)local_158._0_8_;
      ppXStack_2c0 = ppXStack_2c0 + 1;
    }
  }
  p_Var16 = (_Base_ptr)(local_158 + 8);
  local_158._16_8_ = 0;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  _Stack_130._M_p = (pointer)0x0;
  local_298._24_8_ = local_298 + 8;
  local_298._16_8_ = (_Base_ptr)0x0;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = 0;
  sStack_270 = 0;
  local_278 = (_Base_ptr)local_298._24_8_;
  aStack_140._M_allocated_capacity = (size_type)p_Var16;
  aStack_140._8_8_ = p_Var16;
  checkElements(iVar7,(vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                       *)local_2c8,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_158,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_298);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_158);
  if (local_2c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2c8,local_2b8._M_allocated_capacity - (long)local_2c8);
  }
  local_158._8_8_ = &aStack_140;
  local_158._16_8_ = 0;
  aStack_140._0_8_ = aStack_140._0_8_ & 0xffffffffffffff00;
  _Stack_130._M_p = (pointer)&local_120;
  local_128 = (_Base_ptr)0x0;
  local_120._M_local_buf[0] = '\0';
  local_110._M_p = local_108 + 8;
  local_108._0_8_ = (_Base_ptr)0x0;
  local_108[8] = '\0';
  local_158._0_4_ = iVar7;
  local_23c = iVar7;
  p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == &local_60._M_impl.super__Rb_tree_header) {
      pVVar1 = (local_1a8->formats).
               super__Vector_base<VulkanHppGenerator::VideoFormat,_std::allocator<VulkanHppGenerator::VideoFormat>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
              ::find(&(local_1a0->m_structs)._M_t,(key_type *)p_Var16);
      std::operator+(&local_260,"Unknown Video Require Capablities struct <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var16);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_260,"> listed for Video Format <");
      iVar7 = local_23c;
      local_1d8._0_8_ = local_1d8 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar14) {
        local_1d8._16_8_ = paVar14->_M_allocated_capacity;
        local_1d8._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_1d8._16_8_ = paVar14->_M_allocated_capacity;
        local_1d8._0_8_ = pcVar2;
      }
      local_1d8._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1d8,pVVar1[-1].name._M_dataplus._M_p,
                          pVVar1[-1].name._M_string_length);
      local_238._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._0_8_ == paVar14) {
        local_238._16_8_ = paVar14->_M_allocated_capacity;
        local_238._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
        local_238._0_8_ = local_238 + 0x10;
      }
      else {
        local_238._16_8_ = paVar14->_M_allocated_capacity;
      }
      local_238._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"> in VideoCodec <");
      local_208._0_8_ = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ == paVar14) {
        local_208._16_8_ = paVar14->_M_allocated_capacity;
        local_208._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
        local_208._0_8_ = local_208 + 0x10;
      }
      else {
        local_208._16_8_ = paVar14->_M_allocated_capacity;
      }
      local_208._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_208,(local_1a8->name)._M_dataplus._M_p,
                          (local_1a8->name)._M_string_length);
      local_2c8 = (undefined1  [8])&local_2b8;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar10->_M_dataplus)._M_p;
      paVar15 = &pbVar10->field_2;
      if (paVar14 == paVar15) {
        local_2b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b8._8_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_2b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2c8 = (undefined1  [8])paVar14;
      }
      ppXStack_2c0 = (pointer)pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8,">");
      local_298._0_8_ = local_298 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar14) {
        local_298._16_8_ = paVar14->_M_allocated_capacity;
        local_298._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_298._16_8_ = paVar14->_M_allocated_capacity;
        local_298._0_8_ = pcVar2;
      }
      local_298._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      checkForError((_Rb_tree_header *)iVar9._M_node !=
                    &(local_1a0->m_structs)._M_t._M_impl.super__Rb_tree_header,iVar7,
                    (string *)local_298);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
      }
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = local_128;
      __s2._M_p = _Stack_130._M_p;
      p_Var16 = iVar9._M_node[3]._M_right;
      p_Var17 = *(_Base_ptr *)(iVar9._M_node + 4);
      while ((p_Var16 != p_Var17 &&
             ((__n = p_Var16[4]._M_parent, __n != p_Var6 ||
              ((__n != (_Base_ptr)0x0 &&
               (iVar7 = bcmp(*(void **)(p_Var16 + 4),__s2._M_p,(size_t)__n), iVar7 != 0))))))) {
        p_Var16 = (_Base_ptr)&p_Var16[0xc]._M_right;
      }
      std::operator+(&local_178,"Unknown member <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_Stack_130);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_178,"> used for Video Require Capabilities struct <");
      iVar7 = local_23c;
      local_198._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p == paVar14) {
        local_198.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_198._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_198,(char *)local_158._8_8_,local_158._16_8_);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar10->_M_dataplus)._M_p;
      paVar15 = &pbVar10->field_2;
      if (paVar14 == paVar15) {
        local_260.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_260.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_260.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_260._M_dataplus._M_p = (pointer)paVar14;
      }
      local_260._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_260,"> in VideoFormat <");
      local_1d8._0_8_ = local_1d8 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar14) {
        local_1d8._16_8_ = paVar14->_M_allocated_capacity;
        local_1d8._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_1d8._16_8_ = paVar14->_M_allocated_capacity;
        local_1d8._0_8_ = pcVar2;
      }
      local_1d8._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1d8,pVVar1[-1].name._M_dataplus._M_p,
                          pVVar1[-1].name._M_string_length);
      local_238._0_8_ = local_238 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar14) {
        local_238._16_8_ = paVar14->_M_allocated_capacity;
        local_238._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_238._16_8_ = paVar14->_M_allocated_capacity;
        local_238._0_8_ = pcVar2;
      }
      local_238._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"> in VideoCodec <");
      local_208._0_8_ = local_208 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar14) {
        local_208._16_8_ = paVar14->_M_allocated_capacity;
        local_208._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_208._16_8_ = paVar14->_M_allocated_capacity;
        local_208._0_8_ = pcVar2;
      }
      local_208._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_208,(local_1a8->name)._M_dataplus._M_p,
                          (local_1a8->name)._M_string_length);
      local_2c8 = (undefined1  [8])&local_2b8;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar10->_M_dataplus)._M_p;
      paVar15 = &pbVar10->field_2;
      if (paVar14 == paVar15) {
        local_2b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b8._8_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_2b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2c8 = (undefined1  [8])paVar14;
      }
      ppXStack_2c0 = (pointer)pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8,">");
      local_298._0_8_ = local_298 + 0x10;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar14) {
        local_298._16_8_ = paVar14->_M_allocated_capacity;
        local_298._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_298._16_8_ = paVar14->_M_allocated_capacity;
        local_298._0_8_ = pcVar2;
      }
      local_298._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      checkForError(p_Var16 != p_Var17,iVar7,(string *)local_298);
      pcVar2 = local_1d8 + 0x10;
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
      }
      if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
      }
      if ((pointer)local_1d8._0_8_ != pcVar2) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      pVVar5 = local_1a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
               ::find(&(pVVar5->m_bitmasks)._M_t,(key_type *)(p_Var16 + 2));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                     "Video Require Capabilities member <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_Stack_130);
      pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2c8,"> is not a bitmask");
      local_298._0_8_ = local_298 + 0x10;
      pcVar3 = (pbVar10->_M_dataplus)._M_p;
      paVar14 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 == paVar14) {
        local_298._16_8_ = paVar14->_M_allocated_capacity;
        local_298._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_298._16_8_ = paVar14->_M_allocated_capacity;
        local_298._0_8_ = pcVar3;
      }
      local_298._8_8_ = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      checkForError((_Rb_tree_header *)iVar11._M_node !=
                    &(pVVar5->m_bitmasks)._M_t._M_impl.super__Rb_tree_header,iVar7,
                    (string *)local_298);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if (local_2c8 != (undefined1  [8])&local_2b8) {
        operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
      }
      iVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
               ::find(&(pVVar5->m_enums)._M_t,(key_type *)&iVar11._M_node[3]._M_left);
      if ((_Rb_tree_header *)iVar12._M_node != &(pVVar5->m_enums)._M_t._M_impl.super__Rb_tree_header
         ) {
        iVar13 = anon_unknown.dwarf_1900a8::findByName<VulkanHppGenerator::EnumValueData>
                           ((vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                             *)&iVar12._M_node[5]._M_left,(string *)&local_110);
        pEVar4 = (EnumValueData *)iVar12._M_node[5]._M_right;
        std::operator+(&local_260,"Unknown value <",(string *)&local_110);
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_260,"> listed for Video Require Capabilities <");
        local_1d8._0_8_ = (pbVar10->_M_dataplus)._M_p;
        paVar14 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ == paVar14) {
          local_1d8._16_8_ = paVar14->_M_allocated_capacity;
          local_1d8._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
          local_1d8._0_8_ = pcVar2;
        }
        else {
          local_1d8._16_8_ = paVar14->_M_allocated_capacity;
        }
        local_1d8._8_8_ = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1d8,(char *)local_158._8_8_,local_158._16_8_);
        local_238._0_8_ = local_238 + 0x10;
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        paVar14 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar14) {
          local_238._16_8_ = paVar14->_M_allocated_capacity;
          local_238._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_238._16_8_ = paVar14->_M_allocated_capacity;
          local_238._0_8_ = pcVar3;
        }
        local_238._8_8_ = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238,"> in Video Codec <");
        local_208._0_8_ = local_208 + 0x10;
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        paVar14 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar14) {
          local_208._16_8_ = paVar14->_M_allocated_capacity;
          local_208._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_208._16_8_ = paVar14->_M_allocated_capacity;
          local_208._0_8_ = pcVar3;
        }
        local_208._8_8_ = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_208,(local_1a8->name)._M_dataplus._M_p,
                            (local_1a8->name)._M_string_length);
        local_2c8 = (undefined1  [8])&local_2b8;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar10->_M_dataplus)._M_p;
        paVar15 = &pbVar10->field_2;
        if (paVar14 == paVar15) {
          local_2b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_2b8._8_8_ = *(long *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_2b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_2c8 = (undefined1  [8])paVar14;
        }
        ppXStack_2c0 = (pointer)pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar15;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2c8,">");
        local_298._0_8_ = local_298 + 0x10;
        pcVar3 = (pbVar10->_M_dataplus)._M_p;
        paVar14 = &pbVar10->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar14) {
          local_298._16_8_ = paVar14->_M_allocated_capacity;
          local_298._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
        }
        else {
          local_298._16_8_ = paVar14->_M_allocated_capacity;
          local_298._0_8_ = pcVar3;
        }
        local_298._8_8_ = pbVar10->_M_string_length;
        (pbVar10->_M_dataplus)._M_p = (pointer)paVar14;
        pbVar10->_M_string_length = 0;
        (pbVar10->field_2)._M_local_buf[0] = '\0';
        checkForError(iVar13._M_current != pEVar4,iVar7,(string *)local_298);
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        if (local_2c8 != (undefined1  [8])&local_2b8) {
          operator_delete((void *)local_2c8,(ulong)(local_2b8._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
          operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
        }
        if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
          operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
        }
        if ((pointer)local_1d8._0_8_ != pcVar2) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<VulkanHppGenerator::VideoRequireCapabilities,_std::allocator<VulkanHppGenerator::VideoRequireCapabilities>_>
        ::push_back(&pVVar1[-1].requireCapabilities,(value_type *)local_158);
        if (local_110._M_p != local_108 + 8) {
          operator_delete(local_110._M_p,CONCAT71(local_108._9_7_,local_108[8]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_130._M_p != &local_120) {
          operator_delete(_Stack_130._M_p,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._8_8_ != &aStack_140) {
          operator_delete((void *)local_158._8_8_,aStack_140._0_8_ + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        return;
      }
      __assert_fail("enumIt != m_enums.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x4151,
                    "void VulkanHppGenerator::readVideoRequireCapabilities(const tinyxml2::XMLElement *, VideoCodec &)"
                   );
    }
    this_00 = p_Var8 + 1;
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                       "member");
    p_Var17 = (_Base_ptr)&_Stack_130;
    if ((iVar7 == 0) ||
       (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00
                        ,"struct"), p_Var17 = p_Var16, iVar7 == 0)) {
LAB_001ed3e7:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var17,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 2));
    }
    else {
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                      "value");
      p_Var17 = (_Base_ptr)&local_110;
      if (iVar7 == 0) goto LAB_001ed3e7;
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void VulkanHppGenerator::readVideoRequireCapabilities( tinyxml2::XMLElement const * element, VideoCodec & videoCodec )
{
  const int                          line       = element->GetLineNum();
  std::map<std::string, std::string> attributes = getAttributes( element );
  checkAttributes( line, attributes, { { "member", {} }, { "struct", {} }, { "value", {} } }, {} );
  checkElements( line, getChildElements( element ), {} );

  VideoRequireCapabilities requireCapabilities;
  requireCapabilities.xmlLine = line;
  for ( auto const & attribute : attributes )
  {
    if ( attribute.first == "member" )
    {
      requireCapabilities.member = attribute.second;
    }
    else if ( attribute.first == "struct" )
    {
      requireCapabilities.name = attribute.second;
    }
    else if ( attribute.first == "value" )
    {
      requireCapabilities.value = attribute.second;
    }
  }

  VideoFormat & format = videoCodec.formats.back();

  auto structIt = m_structs.find( requireCapabilities.name );
  checkForError( structIt != m_structs.end(),
                 line,
                 "Unknown Video Require Capablities struct <" + requireCapabilities.name + "> listed for Video Format <" + format.name + "> in VideoCodec <" +
                   videoCodec.name + ">" );

  auto memberIt = findByName( structIt->second.members, requireCapabilities.member );
  checkForError( memberIt != structIt->second.members.end(),
                 line,
                 "Unknown member <" + requireCapabilities.member + "> used for Video Require Capabilities struct <" + requireCapabilities.name +
                   "> in VideoFormat <" + format.name + "> in VideoCodec <" + videoCodec.name + ">" );

  auto bitmaskIt = m_bitmasks.find( memberIt->type.type );
  checkForError( bitmaskIt != m_bitmasks.end(), line, "Video Require Capabilities member <" + requireCapabilities.member + "> is not a bitmask" );

  auto enumIt = m_enums.find( bitmaskIt->second.require );
  assert( enumIt != m_enums.end() );

  checkForError( findByName( enumIt->second.values, requireCapabilities.value ) != enumIt->second.values.end(),
                 line,
                 "Unknown value <" + requireCapabilities.value + "> listed for Video Require Capabilities <" + requireCapabilities.name + "> in Video Codec <" +
                   videoCodec.name + ">" );

  format.requireCapabilities.push_back( requireCapabilities );
}